

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void llvm::DWARFYAML::EmitDebugRanges(raw_ostream *OS,Data *DI)

{
  pointer pRVar1;
  uint64_t uVar2;
  pointer pRVar3;
  
  pRVar1 = (DI->Ranges).
           super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (DI->Ranges).
                super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    uVar2 = pRVar3->End;
    writeInteger<unsigned_int>((uint)pRVar3->Start,OS,DI->IsLittleEndian);
    writeInteger<unsigned_int>((uint)uVar2,OS,DI->IsLittleEndian);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugRanges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  // As DwarfStreamer.cpp says, "The debug_range section
  // format is totally trivial, consisting just of pairs of address
  // sized addresses describing the ranges." and apparently it ends
  // with a null termination of a pair of zeros
  for (auto Range : DI.Ranges) {
    writeInteger((uint32_t)Range.Start, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.End, OS, DI.IsLittleEndian);
  }
}